

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateActivation
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  undefined8 uVar1;
  bool bVar2;
  NonlinearityTypeCase NVar3;
  ActivationParams *pAVar4;
  allocator local_1e9;
  undefined1 local_1e8 [32];
  Result local_1c8;
  undefined1 local_198 [32];
  Result local_178;
  undefined1 local_148 [32];
  Result local_128;
  undefined1 local_f8 [32];
  Result local_d8;
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,1);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar2 = Result::good((Result *)(local_70 + 0x28));
  if (bVar2) {
    validateOutputCount((Result_conflict *)&local_a8,(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),&local_a8);
    Result::~Result(&local_a8);
  }
  bVar2 = Result::good((Result *)(local_70 + 0x28));
  if (!bVar2) {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    goto LAB_003fb122;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    pAVar4 = Specification::NeuralNetworkLayer::activation((NeuralNetworkLayer *)r._32_8_);
    NVar3 = Specification::ActivationParams::NonlinearityType_case(pAVar4);
    uVar1 = r._32_8_;
    if (NVar3 == kPReLU) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_f8,"ActivationPReLU",
                 (allocator *)((long)local_128.m_message._M_storage._M_storage + 7));
      validateInputOutputRankEquality
                ((Result_conflict *)(local_f8 + 0x20),(NeuralNetworkLayer *)uVar1,(string *)local_f8
                 ,&this->blobNameToRank);
      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_f8 + 0x20));
      Result::~Result((Result *)(local_f8 + 0x20));
      std::__cxx11::string::~string((string *)local_f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)local_128.m_message._M_storage._M_storage + 7));
      bVar2 = Result::good((Result *)(local_70 + 0x28));
      uVar1 = r._32_8_;
      if (!bVar2) {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        goto LAB_003fb122;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_148,"ActivationPReLU",
                 (allocator *)((long)local_178.m_message._M_storage._M_storage + 7));
      validateRankCount((Result_conflict *)(local_148 + 0x20),(NeuralNetworkLayer *)uVar1,
                        (string *)local_148,3,-1,&this->blobNameToRank);
      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_148 + 0x20));
      Result::~Result((Result *)(local_148 + 0x20));
      std::__cxx11::string::~string((string *)local_148);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)local_178.m_message._M_storage._M_storage + 7));
      bVar2 = Result::good((Result *)(local_70 + 0x28));
      if (!bVar2) {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        goto LAB_003fb122;
      }
    }
    pAVar4 = Specification::NeuralNetworkLayer::activation((NeuralNetworkLayer *)r._32_8_);
    NVar3 = Specification::ActivationParams::NonlinearityType_case(pAVar4);
    uVar1 = r._32_8_;
    if (NVar3 == kParametricSoftplus) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_198,"ActivationParametricSoftplus",
                 (allocator *)((long)local_1c8.m_message._M_storage._M_storage + 7));
      validateInputOutputRankEquality
                ((Result_conflict *)(local_198 + 0x20),(NeuralNetworkLayer *)uVar1,
                 (string *)local_198,&this->blobNameToRank);
      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_198 + 0x20));
      Result::~Result((Result *)(local_198 + 0x20));
      std::__cxx11::string::~string((string *)local_198);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)local_1c8.m_message._M_storage._M_storage + 7));
      bVar2 = Result::good((Result *)(local_70 + 0x28));
      uVar1 = r._32_8_;
      if (!bVar2) {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        goto LAB_003fb122;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_1e8,"ActivationParametricSoftplus",&local_1e9);
      validateRankCount((Result_conflict *)(local_1e8 + 0x20),(NeuralNetworkLayer *)uVar1,
                        (string *)local_1e8,3,-1,&this->blobNameToRank);
      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_1e8 + 0x20));
      Result::~Result((Result *)(local_1e8 + 0x20));
      std::__cxx11::string::~string((string *)local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      bVar2 = Result::good((Result *)(local_70 + 0x28));
      if (!bVar2) {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        goto LAB_003fb122;
      }
    }
  }
  pAVar4 = Specification::NeuralNetworkLayer::activation((NeuralNetworkLayer *)r._32_8_);
  validateActivationParams(__return_storage_ptr__,pAVar4);
LAB_003fb122:
  local_d8.m_message._M_storage._M_storage[4] = '\x01';
  local_d8.m_message._M_storage._M_storage[5] = '\0';
  local_d8.m_message._M_storage._M_storage[6] = '\0';
  local_d8.m_message._M_storage._M_storage[7] = '\0';
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateActivation(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()) {return r;}
    if (ndArrayInterpretation) {
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kPReLU) {
            r = validateInputOutputRankEquality(layer, "ActivationPReLU", blobNameToRank);
            if (!r.good()) {return r;}
            r = validateRankCount(layer, "ActivationPReLU", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus) {
            r = validateInputOutputRankEquality(layer, "ActivationParametricSoftplus", blobNameToRank);
            if (!r.good()) {return r;}
            r = validateRankCount(layer, "ActivationParametricSoftplus", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }
    }

    return validateActivationParams(layer.activation());
}